

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O1

void examine_app0(j_decompress_ptr cinfo,JOCTET *data,uint datalen,INT32 remaining)

{
  byte bVar1;
  JOCTET JVar2;
  jpeg_error_mgr *pjVar3;
  long lVar4;
  
  lVar4 = (ulong)datalen + remaining;
  if ((((datalen < 0xe) || (*data != 'J')) || (data[1] != 'F')) ||
     (((data[2] != 'I' || (data[3] != 'F')) || (data[4] != '\0')))) {
    if (((datalen < 6) || (*data != 'J')) ||
       ((data[1] != 'F' || (((data[2] != 'X' || (data[3] != 'X')) || (data[4] != '\0')))))) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x4f;
    }
    else {
      JVar2 = data[5];
      pjVar3 = cinfo->err;
      if (JVar2 == '\x13') {
        pjVar3->msg_code = 0x70;
      }
      else if (JVar2 == '\x11') {
        pjVar3->msg_code = 0x6f;
      }
      else {
        if (JVar2 != '\x10') {
          pjVar3->msg_code = 0x5b;
          *(uint *)&pjVar3->msg_parm = (uint)data[5];
          (cinfo->err->msg_parm).i[1] = (int)lVar4;
          goto LAB_0027cb1e;
        }
        pjVar3->msg_code = 0x6e;
      }
    }
  }
  else {
    cinfo->saw_JFIF_marker = 1;
    bVar1 = data[5];
    cinfo->JFIF_major_version = bVar1;
    cinfo->JFIF_minor_version = data[6];
    cinfo->density_unit = data[7];
    cinfo->X_density = *(ushort *)(data + 8) << 8 | *(ushort *)(data + 8) >> 8;
    cinfo->Y_density = *(ushort *)(data + 10) << 8 | *(ushort *)(data + 10) >> 8;
    if (bVar1 != 1) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x7a;
      (pjVar3->msg_parm).i[0] = (uint)bVar1;
      *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)cinfo->JFIF_minor_version;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
    }
    pjVar3 = cinfo->err;
    *(uint *)&pjVar3->msg_parm = (uint)cinfo->JFIF_major_version;
    *(uint *)((long)&pjVar3->msg_parm + 4) = (uint)cinfo->JFIF_minor_version;
    *(uint *)((long)&pjVar3->msg_parm + 8) = (uint)cinfo->X_density;
    *(uint *)((long)&pjVar3->msg_parm + 0xc) = (uint)cinfo->Y_density;
    *(uint *)((long)&pjVar3->msg_parm + 0x10) = (uint)cinfo->density_unit;
    pjVar3->msg_code = 0x59;
    (*pjVar3->emit_message)((j_common_ptr)cinfo,1);
    if (data[0xd] != '\0' || data[0xc] != '\0') {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x5c;
      *(uint *)&pjVar3->msg_parm = (uint)data[0xc];
      *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)data[0xd];
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    }
    lVar4 = lVar4 + -0xe;
    if (lVar4 == (ulong)data[0xd] * (ulong)data[0xc] * 3) {
      return;
    }
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x5a;
  }
  (pjVar3->msg_parm).i[0] = (int)lVar4;
LAB_0027cb1e:
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  return;
}

Assistant:

LOCAL(void)
examine_app0 (j_decompress_ptr cinfo, JOCTET FAR * data,
	      unsigned int datalen, INT32 remaining)
/* Examine first few bytes from an APP0.
 * Take appropriate action if it is a JFIF marker.
 * datalen is # of bytes at data[], remaining is length of rest of marker data.
 */
{
  INT32 totallen = (INT32) datalen + remaining;

  if (datalen >= APP0_DATA_LEN &&
      GETJOCTET(data[0]) == 0x4A &&
      GETJOCTET(data[1]) == 0x46 &&
      GETJOCTET(data[2]) == 0x49 &&
      GETJOCTET(data[3]) == 0x46 &&
      GETJOCTET(data[4]) == 0) {
    /* Found JFIF APP0 marker: save info */
    cinfo->saw_JFIF_marker = TRUE;
    cinfo->JFIF_major_version = GETJOCTET(data[5]);
    cinfo->JFIF_minor_version = GETJOCTET(data[6]);
    cinfo->density_unit = GETJOCTET(data[7]);
    cinfo->X_density = (GETJOCTET(data[8]) << 8) + GETJOCTET(data[9]);
    cinfo->Y_density = (GETJOCTET(data[10]) << 8) + GETJOCTET(data[11]);
    /* Check version.
     * Major version must be 1, anything else signals an incompatible change.
     * (We used to treat this as an error, but now it's a nonfatal warning,
     * because some bozo at Hijaak couldn't read the spec.)
     * Minor version should be 0..2, but process anyway if newer.
     */
    if (cinfo->JFIF_major_version != 1)
      WARNMS2(cinfo, JWRN_JFIF_MAJOR,
	      cinfo->JFIF_major_version, cinfo->JFIF_minor_version);
    /* Generate trace messages */
    TRACEMS5(cinfo, 1, JTRC_JFIF,
	     cinfo->JFIF_major_version, cinfo->JFIF_minor_version,
	     cinfo->X_density, cinfo->Y_density, cinfo->density_unit);
    /* Validate thumbnail dimensions and issue appropriate messages */
    if (GETJOCTET(data[12]) | GETJOCTET(data[13]))
      TRACEMS2(cinfo, 1, JTRC_JFIF_THUMBNAIL,
	       GETJOCTET(data[12]), GETJOCTET(data[13]));
    totallen -= APP0_DATA_LEN;
    if (totallen !=
	((INT32)GETJOCTET(data[12]) * (INT32)GETJOCTET(data[13]) * (INT32) 3))
      TRACEMS1(cinfo, 1, JTRC_JFIF_BADTHUMBNAILSIZE, (int) totallen);
  } else if (datalen >= 6 &&
      GETJOCTET(data[0]) == 0x4A &&
      GETJOCTET(data[1]) == 0x46 &&
      GETJOCTET(data[2]) == 0x58 &&
      GETJOCTET(data[3]) == 0x58 &&
      GETJOCTET(data[4]) == 0) {
    /* Found JFIF "JFXX" extension APP0 marker */
    /* The library doesn't actually do anything with these,
     * but we try to produce a helpful trace message.
     */
    switch (GETJOCTET(data[5])) {
    case 0x10:
      TRACEMS1(cinfo, 1, JTRC_THUMB_JPEG, (int) totallen);
      break;
    case 0x11:
      TRACEMS1(cinfo, 1, JTRC_THUMB_PALETTE, (int) totallen);
      break;
    case 0x13:
      TRACEMS1(cinfo, 1, JTRC_THUMB_RGB, (int) totallen);
      break;
    default:
      TRACEMS2(cinfo, 1, JTRC_JFIF_EXTENSION,
	       GETJOCTET(data[5]), (int) totallen);
      break;
    }
  } else {
    /* Start of APP0 does not match "JFIF" or "JFXX", or too short */
    TRACEMS1(cinfo, 1, JTRC_APP0, (int) totallen);
  }
}